

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_window.c
# Opt level: O0

void fitToMonitor(_GLFWwindow *window)

{
  GLFWvidmode *in_RDI;
  _GLFWmonitor *unaff_retaddr;
  GLFWvidmode mode;
  int local_20;
  int local_1c;
  
  _glfwGetVideoModeNull(unaff_retaddr,in_RDI);
  _glfwGetMonitorPosNull
            (*(_GLFWmonitor **)&in_RDI[3].redBits,&in_RDI[0x8c].redBits,&in_RDI[0x8c].greenBits);
  in_RDI[0x8c].blueBits = local_20;
  in_RDI[0x8c].refreshRate = local_1c;
  return;
}

Assistant:

static void fitToMonitor(_GLFWwindow* window)
{
    GLFWvidmode mode;
    _glfwGetVideoModeNull(window->monitor, &mode);
    _glfwGetMonitorPosNull(window->monitor,
                           &window->null.xpos,
                           &window->null.ypos);
    window->null.width = mode.width;
    window->null.height = mode.height;
}